

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string *psVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  pointer pbVar11;
  mapped_type *this_00;
  long lVar12;
  pointer piVar13;
  pointer pbVar14;
  int iVar15;
  ulong uVar16;
  int retVal;
  string *local_9d8;
  int local_9cc;
  string lcovFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string nl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string errors;
  string lineNumber;
  string sourceFile;
  string srcname;
  string daGlob;
  string dir;
  string actualSourceFile;
  string command;
  string fileDir;
  string lcovCommand;
  ostringstream cmCTestLog_msg;
  byte abStack_790 [488];
  string lcovExtraFlags;
  ostringstream cmCTestLog_msg_14;
  byte abStack_568 [488];
  string st2lcovOutputRex3;
  cmWorkingDirectory workdir;
  cmCTestCoverageHandlerLocale locale_C;
  string testingDir;
  Glob gl;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  ostringstream cmCTestLog_msg_20;
  RegularExpression st2re3;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"CoverageCommand",(allocator *)&cmCTestLog_msg_14);
  cmCTest::GetCTestConfiguration(&lcovCommand,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,"CoverageExtraFlags",(allocator *)&cmCTestLog_msg_14);
  cmCTest::GetCTestConfiguration(&lcovExtraFlags,pcVar1,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  bVar4 = std::operator!=(&lcovCommand,"codecov");
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg," Not a valid Intel Coverage command.");
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x51f,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar15 = 0;
  }
  else {
    std::__cxx11::string::string
              ((string *)&st2lcovOutputRex3,"[0-9]+%",(allocator *)&cmCTestLog_msg);
    cmsys::RegularExpression::RegularExpression(&st2re3,st2lcovOutputRex3._M_dataplus._M_p);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg," This is coverage command: ");
    poVar8 = std::operator<<(poVar8,(string *)&lcovCommand);
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x528,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg," These are coverage command flags: ");
    poVar8 = std::operator<<(poVar8,(string *)&lcovExtraFlags);
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x52d,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = FindLCovFiles(this,&files);
    if (bVar4) {
      if (files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg," Cannot find any LCov coverage files.")
        ;
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x53a,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        iVar15 = 0;
      }
      else {
        cmCTest::GetBinaryDir_abi_cxx11_(&testingDir,(this->super_cmCTestGenericHandler).CTest);
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &missingFiles._M_t._M_impl.super__Rb_tree_header._M_header;
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        actualSourceFile._M_dataplus._M_p = (pointer)&actualSourceFile.field_2;
        actualSourceFile._M_string_length = 0;
        actualSourceFile.field_2._M_local_buf[0] = '\0';
        missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             missingFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "   Processing coverage (each . represents one file):");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x546,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"    ");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x547,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale(&locale_C);
        iVar15 = 0;
        pbVar9 = files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while (pbVar9 != files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::operator<<((ostream *)&cmCTestLog_msg,".");
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x552,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          cmsys::SystemTools::GetFilenamePath(&fileDir,pbVar9);
          cmWorkingDirectory::cmWorkingDirectory(&workdir,&fileDir);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg_20,"\"",&lcovCommand);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg_14,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg_20,"\" ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg_14,&lcovExtraFlags);
          std::operator+(&command,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cmCTestLog_msg," ");
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Current coverage dir: ");
          poVar8 = std::operator<<(poVar8,(string *)&fileDir);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x559,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&command);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x55b,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          local_9d8 = pbVar9;
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          output._M_dataplus._M_p = (pointer)&output.field_2;
          output._M_string_length = 0;
          output.field_2._M_local_buf[0] = '\0';
          errors._M_dataplus._M_p = (pointer)&errors.field_2;
          errors._M_string_length = 0;
          errors.field_2._M_local_buf[0] = '\0';
          retVal = 0;
          poVar8 = std::operator<<(cont->OFS,"* Run coverage for: ");
          poVar8 = std::operator<<(poVar8,(string *)&fileDir);
          std::endl<char,std::char_traits<char>>(poVar8);
          poVar8 = std::operator<<(cont->OFS,"  Command: ");
          poVar8 = std::operator<<(poVar8,(string *)&command);
          std::endl<char,std::char_traits<char>>(poVar8);
          bVar4 = cmCTest::RunCommand((this->super_cmCTestGenericHandler).CTest,
                                      command._M_dataplus._M_p,&output,&errors,&retVal,
                                      fileDir._M_dataplus._M_p,0.0,Auto);
          poVar8 = std::operator<<(cont->OFS,"  Output: ");
          poVar8 = std::operator<<(poVar8,(string *)&output);
          std::endl<char,std::char_traits<char>>(poVar8);
          poVar8 = std::operator<<(cont->OFS,"  Errors: ");
          poVar8 = std::operator<<(poVar8,(string *)&errors);
          std::endl<char,std::char_traits<char>>(poVar8);
          psVar2 = local_9d8;
          if (bVar4) {
            if (retVal != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Coverage command returned: ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,retVal);
              poVar8 = std::operator<<(poVar8," while processing: ");
              poVar8 = std::operator<<(poVar8,(string *)psVar2);
              std::endl<char,std::char_traits<char>>(poVar8);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,6,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x572,_cmCTestLog_msg_14,false);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Command produced error: ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,cont->Error);
              std::endl<char,std::char_traits<char>>(poVar8);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,6,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x574,_cmCTestLog_msg_14,false);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                                     "--------------------------------------------------------------"
                                    );
            poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<(poVar8,(string *)&output);
            poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<(poVar8,
                                     "--------------------------------------------------------------"
                                    );
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x57d,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            lines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmSystemTools::Split(output._M_dataplus._M_p,&lines);
            pbVar9 = lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (pbVar9 == lines.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                iVar15 = iVar15 + 1;
                iVar6 = 0;
                if (iVar15 % 0x32 == 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg," processed: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar15);
                  poVar8 = std::operator<<(poVar8," out of ");
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x60d,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                  std::operator<<((ostream *)&cmCTestLog_msg,"    ");
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x60e,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
                }
                break;
              }
              sourceFile._M_dataplus._M_p = (pointer)&sourceFile.field_2;
              sourceFile._M_string_length = 0;
              sourceFile.field_2._M_local_buf[0] = '\0';
              lcovFile._M_dataplus._M_p = (pointer)&lcovFile.field_2;
              lcovFile._M_string_length = 0;
              lcovFile.field_2._M_local_buf[0] = '\0';
              cmsys::Glob::Glob(&gl);
              dir._M_dataplus._M_p = (pointer)&dir.field_2;
              dir._M_string_length = 0;
              gl.Recurse = true;
              gl.RecurseThroughSymlinks = false;
              dir.field_2._M_local_buf[0] = '\0';
              lcovFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              lcovFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              lcovFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmCTest::GetBinaryDir_abi_cxx11_
                        ((string *)&cmCTestLog_msg,(this->super_cmCTestGenericHandler).CTest);
              std::__cxx11::string::operator=((string *)&dir,(string *)&cmCTestLog_msg);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg);
              daGlob._M_dataplus._M_p = (pointer)&daGlob.field_2;
              daGlob._M_string_length = 0;
              daGlob.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::_M_assign((string *)&daGlob);
              std::__cxx11::string::append((char *)&daGlob);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"   looking for LCOV files in: ");
              poVar8 = std::operator<<(poVar8,(string *)&daGlob);
              std::endl<char,std::char_traits<char>>(poVar8);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x599,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
              std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
              pbVar14 = lcovFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pvVar10 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
              __first._M_current =
                   (pvVar10->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
              pvVar10 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &lcovFiles,(const_iterator)pbVar14,__first,
                         (pvVar10->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
              pbVar14 = lcovFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                pbVar11 = pbVar14;
                pbVar3 = lcovFiles.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (pbVar11 ==
                    lcovFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  iVar6 = 0;
                  goto LAB_002f96a6;
                }
                std::__cxx11::string::_M_assign((string *)&lcovFile);
                std::ifstream::ifstream(&cmCTestLog_msg,lcovFile._M_dataplus._M_p,_S_in);
                if ((abStack_790[*(long *)(_cmCTestLog_msg + -0x18)] & 5) != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
                  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"Cannot open file: ");
                  poVar8 = std::operator<<(poVar8,(string *)&lcovFile);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,6,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5a5,_cmCTestLog_msg_20,false);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
                }
                srcname._M_dataplus._M_p = (pointer)&srcname.field_2;
                srcname._M_string_length = 0;
                srcname.field_2._M_local_buf[0] = '\0';
                bVar4 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&cmCTestLog_msg,&srcname,(bool *)0x0,-1);
                if (bVar4) {
                  std::__cxx11::string::substr((ulong)&cmCTestLog_msg_14,(ulong)&srcname);
                  std::__cxx11::string::operator=((string *)&srcname,(string *)&cmCTestLog_msg_14);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
                  std::__cxx11::string::_M_assign((string *)&sourceFile);
                  std::__cxx11::string::_M_assign((string *)&actualSourceFile);
                  for (pbVar14 = lcovFiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      pbVar14 !=
                      lcovFiles.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
                    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"Found LCOV File: ");
                    poVar8 = std::operator<<(poVar8,(string *)pbVar14);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5bb,_cmCTestLog_msg_20,(this->super_cmCTestGenericHandler).Quiet
                                );
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14)
                    ;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
                  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"SourceFile: ");
                  poVar8 = std::operator<<(poVar8,(string *)&sourceFile);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5bf,_cmCTestLog_msg_20,(this->super_cmCTestGenericHandler).Quiet);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
                  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"lCovFile: ");
                  poVar8 = std::operator<<(poVar8,(string *)&lcovFile);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5c1,_cmCTestLog_msg_20,(this->super_cmCTestGenericHandler).Quiet);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
                  if ((lcovFile._M_string_length != 0) && (actualSourceFile._M_string_length != 0))
                  {
                    this_00 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                              ::operator[](&cont->TotalCoverage,&actualSourceFile);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
                    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"   in lcovFile: ");
                    poVar8 = std::operator<<(poVar8,(string *)&lcovFile);
                    std::endl<char,std::char_traits<char>>(poVar8);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar1,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5ca,_cmCTestLog_msg_20,(this->super_cmCTestGenericHandler).Quiet
                                );
                    std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14)
                    ;
                    std::ifstream::ifstream
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cmCTestLog_msg_14,lcovFile._M_dataplus._M_p,_S_in);
                    if ((abStack_568[*(long *)(_cmCTestLog_msg_14 + -0x18)] & 5) == 0) {
                      nl._M_dataplus._M_p = (pointer)&nl.field_2;
                      nl._M_string_length = 0;
                      nl.field_2._M_local_buf[0] = '\0';
                      cmsys::SystemTools::GetLineFromStream
                                ((istream *)&cmCTestLog_msg_14,&nl,(bool *)0x0,-1);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)&cmCTestLog_msg_20);
                      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_20,
                                               "File is ready, start reading.");
                      std::endl<char,std::char_traits<char>>(poVar8);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5d8,lineNumber._M_dataplus._M_p,
                                   (this->super_cmCTestGenericHandler).Quiet);
                      std::__cxx11::string::~string((string *)&lineNumber);
                      std::__cxx11::ostringstream::~ostringstream
                                ((ostringstream *)&cmCTestLog_msg_20);
                      while (bVar5 = cmsys::SystemTools::GetLineFromStream
                                               ((istream *)&cmCTestLog_msg_14,&nl,(bool *)0x0,-1),
                            bVar5) {
                        if (0xb < nl._M_string_length) {
                          std::__cxx11::string::substr((ulong)&cmCTestLog_msg_20,(ulong)&nl);
                          iVar6 = atoi(_cmCTestLog_msg_20);
                          std::__cxx11::string::substr((ulong)&lineNumber,(ulong)&nl);
                          iVar7 = atoi(lineNumber._M_dataplus._M_p);
                          if (0 < iVar7) {
                            uVar16 = (ulong)(iVar7 - 1);
                            while (piVar13 = (this_00->super__Vector_base<int,_std::allocator<int>_>
                                             )._M_impl.super__Vector_impl_data._M_start,
                                  (ulong)((long)(this_00->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)piVar13 >> 2) <= uVar16) {
                              local_9cc = -1;
                              std::vector<int,_std::allocator<int>_>::emplace_back<int>
                                        (this_00,&local_9cc);
                            }
                            iVar7 = piVar13[uVar16];
                            if (iVar7 < 0) {
                              if (iVar6 < 1) {
                                lVar12 = std::__cxx11::string::find
                                                   ((char)(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cmCTestLog_msg_20,0x23);
                                piVar13 = (this_00->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start;
                                if (lVar12 == -1) {
                                  iVar7 = piVar13[uVar16];
                                  goto LAB_002f961e;
                                }
                              }
                              piVar13[uVar16] = 0;
                              iVar7 = 0;
                            }
LAB_002f961e:
                            piVar13[uVar16] = iVar7 + iVar6;
                          }
                          std::__cxx11::string::~string((string *)&lineNumber);
                          std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
                        }
                      }
                      std::__cxx11::string::~string((string *)&nl);
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)&cmCTestLog_msg_20);
                      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_20,"Cannot open file: ");
                      poVar8 = std::operator<<(poVar8,(string *)&lcovFile);
                      std::endl<char,std::char_traits<char>>(poVar8);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::stringbuf::str();
                      cmCTest::Log(pcVar1,6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5cf,nl._M_dataplus._M_p,false);
                      std::__cxx11::string::~string((string *)&nl);
                      std::__cxx11::ostringstream::~ostringstream
                                ((ostringstream *)&cmCTestLog_msg_20);
                    }
                    std::__cxx11::string::assign((char *)&actualSourceFile);
                    std::ifstream::~ifstream
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cmCTestLog_msg_14);
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
                  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,
                                           "Error while parsing lcov file \'");
                  poVar8 = std::operator<<(poVar8,(string *)&lcovFile);
                  poVar8 = std::operator<<(poVar8,"\':");
                  poVar8 = std::operator<<(poVar8," No source file name found!");
                  std::endl<char,std::char_traits<char>>(poVar8);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,6,
                               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x5ae,_cmCTestLog_msg_20,false);
                  std::__cxx11::string::~string((string *)&cmCTestLog_msg_20);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
                }
                std::__cxx11::string::~string((string *)&srcname);
                std::ifstream::~ifstream(&cmCTestLog_msg);
                pbVar14 = pbVar11 + 1;
              } while (bVar4);
              iVar6 = 1;
LAB_002f96a6:
              std::__cxx11::string::~string((string *)&daGlob);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&lcovFiles);
              std::__cxx11::string::~string((string *)&dir);
              cmsys::Glob::~Glob(&gl);
              std::__cxx11::string::~string((string *)&lcovFile);
              std::__cxx11::string::~string((string *)&sourceFile);
              pbVar9 = pbVar9 + 1;
            } while (pbVar11 == pbVar3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&lines);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            psVar2 = local_9d8;
            poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem running coverage on file: "
                                    );
            poVar8 = std::operator<<(poVar8,(string *)psVar2);
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x56a,_cmCTestLog_msg_14,false);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Command produced error: ");
            poVar8 = std::operator<<(poVar8,(string *)&errors);
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x56c,_cmCTestLog_msg_14,false);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            cont->Error = cont->Error + 1;
            iVar6 = 0x12;
          }
          std::__cxx11::string::~string((string *)&errors);
          std::__cxx11::string::~string((string *)&output);
          std::__cxx11::string::~string((string *)&command);
          cmWorkingDirectory::~cmWorkingDirectory(&workdir);
          std::__cxx11::string::~string((string *)&fileDir);
          if ((iVar6 != 0x12) && (iVar6 != 0)) {
            iVar15 = 0;
            break;
          }
          pbVar9 = local_9d8 + 1;
        }
        cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale(&locale_C);
        std::__cxx11::string::~string((string *)&actualSourceFile);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&missingFiles._M_t);
        std::__cxx11::string::~string((string *)&testingDir);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,"Error while finding LCov files.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      iVar15 = 0;
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x532,_cmCTestLog_msg_14,false);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    cmsys::RegularExpression::~RegularExpression(&st2re3);
    std::__cxx11::string::~string((string *)&st2lcovOutputRex3);
  }
  std::__cxx11::string::~string((string *)&lcovExtraFlags);
  std::__cxx11::string::~string((string *)&lcovCommand);
  return iVar15;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }
  std::vector<std::string>::iterator it;

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (it = files.begin(); it != files.end(); ++it) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(*it);
    cmWorkingDirectory workdir(fileDir);
    std::string command = "\"" + lcovCommand + "\" " + lcovExtraFlags + " ";

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res =
      this->CTest->RunCommand(command.c_str(), &output, &errors, &retVal,
                              fileDir.c_str(), 0 /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Coverage command returned: "
                   << retVal << " while processing: " << *it << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    std::vector<std::string>::iterator line;

    cmSystemTools::Split(output.c_str(), lines);

    for (line = lines.begin(); line != lines.end(); ++line) {
      std::string sourceFile;
      std::string lcovFile;

      if (line->empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      lcovFiles.insert(lcovFiles.end(), gl.GetFiles().begin(),
                       gl.GetFiles().end());

      for (std::vector<std::string>::iterator a = lcovFiles.begin();
           a != lcovFiles.end(); ++a) {
        lcovFile = *a;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::vector<std::string>::iterator t = lcovFiles.begin();
             t != lcovFiles.end(); ++t) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << *t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              cnt++;

              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile = "";
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}